

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

double __thiscall chrono::ChSystem::ComputeCollisions(ChSystem *this)

{
  element_type *peVar1;
  pointer psVar2;
  pointer psVar3;
  long *plVar4;
  int iVar5;
  rep_conflict rVar6;
  pointer psVar7;
  long lVar8;
  size_t ic;
  ulong uVar9;
  shared_ptr<chrono::ChProximityContainer> sVar10;
  CProfileSample __ch_profile_1;
  CProfileSample __ch_profile;
  shared_ptr<chrono::ChContactContainer> mcontactcontainer;
  CProfileSample local_4a;
  CProfileSample local_49;
  ChTimer<double> *local_48;
  shared_ptr<chrono::ChPhysicsItem> local_40;
  
  utils::ChProfileManager::Start_Profile("ComputeCollisions");
  rVar6 = std::chrono::_V2::system_clock::now();
  (this->timer_collision).m_start.__d.__r = rVar6;
  ChAssembly::SyncCollisionModels(&this->assembly);
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[6])();
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[7])();
  (*((this->collision_system).
     super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChCollisionSystem[8])();
  utils::ChProfileManager::Start_Profile("ReportContacts");
  peVar1 = (this->collision_system).
           super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_ChCollisionSystem[0xe])
            (peVar1,(this->contact_container).
                    super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  psVar2 = (this->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &this->timer_collision;
  for (psVar7 = (this->assembly).otherphysicslist.
                super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    std::dynamic_pointer_cast<chrono::ChContactContainer,chrono::ChPhysicsItem>(&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    sVar10 = std::dynamic_pointer_cast<chrono::ChProximityContainer,chrono::ChPhysicsItem>
                       (&local_40);
    if (local_40.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar1 = (this->collision_system).
               super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_ChCollisionSystem[0xf])
                (peVar1,local_40.
                        super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,sVar10.
                  super___shared_ptr<chrono::ChProximityContainer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._M_pi);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  utils::CProfileSample::~CProfileSample(&local_4a);
  lVar8 = 0;
  uVar9 = 0;
  while( true ) {
    psVar3 = (this->collision_callbacks).
             super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->collision_callbacks).
                      super__Vector_base<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>,_std::allocator<std::shared_ptr<chrono::ChSystem::CustomCollisionCallback>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar9)
    break;
    plVar4 = *(long **)((long)&(psVar3->
                               super___shared_ptr<chrono::ChSystem::CustomCollisionCallback,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar8);
    (**(code **)(*plVar4 + 0x10))(plVar4,this);
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0x10;
  }
  iVar5 = (*(((this->contact_container).
              super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3c])();
  this->ncontacts = iVar5;
  ChTimer<double>::stop(local_48);
  utils::CProfileSample::~CProfileSample(&local_49);
  return 0.0;
}

Assistant:

double ChSystem::ComputeCollisions() {
    CH_PROFILE("ComputeCollisions");

    double mretC = 0.0;

    timer_collision.start();

    // Update all positions of collision models: delegate this to the ChAssembly
    assembly.SyncCollisionModels();

    // Perform the collision detection ( broadphase and narrowphase )
    collision_system->PreProcess();
    collision_system->Run();
    collision_system->PostProcess();

    // Report and store contacts and/or proximities, if there are some
    // containers in the physic system. The default contact container
    // for ChBody and ChParticles is used always.
    {
        CH_PROFILE("ReportContacts");

        collision_system->ReportContacts(contact_container.get());

        for (auto& item : assembly.otherphysicslist) {
            if (auto mcontactcontainer = std::dynamic_pointer_cast<ChContactContainer>(item)) {
                // collision_system->ReportContacts(mcontactcontainer.get());
                // ***TEST*** if one wants to populate a ChContactContainer this would clear it anyway...
            }

            if (auto mproximitycontainer = std::dynamic_pointer_cast<ChProximityContainer>(item)) {
                collision_system->ReportProximities(mproximitycontainer.get());
            }
        }
    }

    // Invoke the custom collision callbacks (if any). These can potentially add
    // additional contacts to the contact container.
    for (size_t ic = 0; ic < collision_callbacks.size(); ic++)
        collision_callbacks[ic]->OnCustomCollision(this);

    // Cache the total number of contacts
    ncontacts = contact_container->GetNcontacts();

    timer_collision.stop();

    return mretC;
}